

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall
BMRS<UF>::FindRunsMem
          (BMRS<UF> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ushort uVar6;
  uint i;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  Run *pRVar11;
  Run *pRVar12;
  ushort uVar13;
  unsigned_short uVar14;
  long lVar15;
  uint uVar16;
  Run *pRVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  short sVar20;
  uint64_t *puVar21;
  uint64_t *puVar22;
  ulong uVar23;
  uint64_t uVar24;
  
  lVar7 = (long)data_width;
  uVar24 = *bits_start;
  sVar20 = 0;
  pRVar11 = runs;
  puVar22 = bits_start;
  while( true ) {
    while (puVar19 = puVar22 + 1, uVar24 != 0) {
      lVar15 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      pRVar11->start_pos = (short)lVar15 + sVar20;
      uVar23 = (~uVar24 >> ((byte)lVar15 & 0x3f)) << ((byte)lVar15 & 0x3f);
      while (uVar23 == 0) {
        sVar20 = sVar20 + 0x40;
        puVar1 = puVar22 + 1;
        puVar22 = puVar22 + 1;
        uVar23 = ~*puVar1;
      }
      lVar15 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      pRVar11->end_pos = (short)lVar15 + sVar20;
      uVar9 = UF::MemNewLabel();
      pRVar11->label = uVar9;
      pRVar11 = pRVar11 + 1;
      uVar24 = (~uVar23 >> ((byte)lVar15 & 0x3f)) << ((byte)lVar15 & 0x3f);
    }
    if (puVar19 == bits_start + lVar7) break;
    sVar20 = sVar20 + 0x40;
    uVar24 = *puVar19;
    puVar22 = puVar19;
  }
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar15 = 1;
LAB_001fdc83:
  if (height <= lVar15) {
    uVar9 = UF::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
    return;
  }
  pRVar12 = pRVar11 + 1;
  puVar22 = bits_flag + (lVar15 + -1) * lVar7;
  puVar19 = bits_start + lVar15 * lVar7;
  puVar21 = puVar19 + lVar7;
  uVar24 = *puVar19;
  lVar8 = 0;
  pRVar11 = pRVar12;
  do {
    while (puVar18 = puVar19 + 1, uVar24 != 0) {
      lVar4 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar23 = (~uVar24 >> ((byte)lVar4 & 0x3f)) << ((byte)lVar4 & 0x3f);
      lVar10 = lVar8;
      while (uVar23 == 0) {
        lVar10 = lVar10 + 0x40;
        puVar1 = puVar19 + 1;
        puVar19 = puVar19 + 1;
        uVar23 = ~*puVar1;
      }
      lVar5 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      uVar9 = (int)lVar4 + (int)lVar8 & 0xffff;
      runs = runs + -1;
      do {
        pRVar17 = runs;
        uVar2 = pRVar17[1].end_pos;
        runs = pRVar17 + 1;
      } while (uVar2 < uVar9);
      uVar13 = (short)lVar4 + (short)lVar8;
      uVar6 = runs->start_pos;
      uVar14 = (unsigned_short)(lVar5 + lVar10);
      uVar16 = (uint)(lVar5 + lVar10) & 0xffff;
      if (uVar16 < uVar6) {
        pRVar11->start_pos = uVar13;
        pRVar11->end_pos = uVar14;
        uVar9 = UF::MemNewLabel();
        pRVar11->label = uVar9;
      }
      else {
        if (uVar6 <= uVar9) {
          uVar6 = uVar13;
        }
        if (uVar2 < uVar16) {
          uVar24 = is_connected(this,puVar22,(uint)uVar6,(uint)uVar2);
          if (uVar24 == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = pRVar17[1].label;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar9] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar9] + 1;
            uVar9 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)uVar9];
          }
          while( true ) {
            i = uVar9;
            pRVar17 = runs;
            runs = pRVar17 + 1;
            uVar2 = runs->start_pos;
            uVar9 = i;
            if (uVar16 < uVar2) break;
            if (uVar16 <= pRVar17[1].end_pos) {
              uVar24 = is_connected(this,puVar22,(uint)uVar2,uVar16);
              if (uVar24 != 0) {
                uVar16 = pRVar17[1].label;
                UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar16] =
                     UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar16] + 1;
                uVar16 = UF::mem_P_.vec_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar16];
                if ((i != uVar16) && (uVar9 = uVar16, i != 0)) {
                  uVar9 = UF::MemMerge(i,uVar16);
                }
              }
              break;
            }
            uVar24 = is_connected(this,puVar22,(uint)uVar2,(uint)pRVar17[1].end_pos);
            if (uVar24 != 0) {
              uVar3 = pRVar17[1].label;
              UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar3] =
                   UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar3] + 1;
              uVar3 = UF::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar3];
              if ((i != uVar3) && (uVar9 = uVar3, i != 0)) {
                uVar9 = UF::MemMerge(i,uVar3);
              }
            }
          }
          if (uVar9 == 0) {
            uVar9 = UF::MemNewLabel();
          }
          pRVar11->label = uVar9;
          pRVar11->start_pos = uVar13;
          pRVar11->end_pos = uVar14;
        }
        else {
          uVar24 = is_connected(this,puVar22,(uint)uVar6,uVar16);
          if (uVar24 == 0) {
            uVar9 = UF::MemNewLabel();
          }
          else {
            uVar9 = pRVar17[1].label;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar9] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar9] + 1;
            uVar9 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)uVar9];
          }
          pRVar11->label = uVar9;
          pRVar11->start_pos = uVar13;
          pRVar11->end_pos = uVar14;
        }
      }
      pRVar11 = pRVar11 + 1;
      lVar8 = lVar10;
      uVar24 = -1L << ((byte)lVar5 & 0x3f) & ~uVar23;
    }
    if (puVar18 == puVar21) break;
    uVar24 = *puVar18;
    lVar8 = lVar8 + 0x40;
    puVar19 = puVar18;
  } while( true );
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar15 = lVar15 + 1;
  runs = pRVar12;
  goto LAB_001fdc83;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::MemGetLabel(runs_up->label);
                    else runs->label = LabelsSolver::MemNewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::MemGetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::MemNewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }